

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O3

string * testing::internal::CanonicalizeForStdLibVersioning
                   (string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  iVar4 = std::__cxx11::string::compare((ulong)s,0,(char *)0x7);
  if ((iVar4 == 0) && (lVar5 = std::__cxx11::string::find((char *)s,0x17c077,7), lVar5 != -1)) {
    std::__cxx11::string::erase((ulong)s,3);
  }
  for (uVar6 = std::__cxx11::string::find((char *)s,0x17e235,0); uVar6 != 0xffffffffffffffff;
      uVar6 = std::__cxx11::string::find((char *)s,0x17e235,uVar6 + 1)) {
    std::__cxx11::string::replace((ulong)s,uVar6,(char *)0x2,0x17e238);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline std::string CanonicalizeForStdLibVersioning(std::string s) {
  static const char prefix[] = "std::__";
  if (s.compare(0, strlen(prefix), prefix) == 0) {
    std::string::size_type end = s.find("::", strlen(prefix));
    if (end != s.npos) {
      // Erase everything between the initial `std` and the second `::`.
      s.erase(strlen("std"), end - strlen("std"));
    }
  }

  // Strip redundant spaces in typename to match MSVC
  // For example, std::pair<int, bool> -> std::pair<int,bool>
  static const char to_search[] = ", ";
  static const char replace_str[] = ",";
  size_t pos = 0;
  while (true) {
    // Get the next occurrence from the current position
    pos = s.find(to_search, pos);
    if (pos == std::string::npos) {
      break;
    }
    // Replace this occurrence of substring
    s.replace(pos, strlen(to_search), replace_str);
    pos += strlen(replace_str);
  }
  return s;
}